

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O0

Graph * Omega_h::add_edges(Graph *__return_storage_ptr__,Graph *g1,Graph *g2)

{
  int size_in;
  char *file;
  Write<int> local_310;
  Read<int> local_300;
  Read<int> local_2f0;
  undefined1 local_2e0 [8];
  type f;
  undefined1 local_260 [8];
  Write<int> e2v;
  Read<int> local_230;
  undefined1 local_220 [8];
  LOs v2e;
  string local_208 [32];
  Read<int> local_1e8;
  Read<int> local_1d8;
  undefined1 local_1c8 [8];
  Read<int> deg;
  string local_1b0 [32];
  Read<int> local_190;
  undefined1 local_180 [8];
  LOs deg2;
  string local_168 [32];
  Read<int> local_148;
  undefined1 local_138 [8];
  LOs deg1;
  undefined1 local_120 [4];
  int nv;
  LOs e2v2;
  LOs v2e2;
  LOs e2v1;
  LOs v2e1;
  allocator local_a9;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [39];
  ScopedTimer local_41;
  Graph *pGStack_40;
  ScopedTimer omega_h_scoped_function_timer;
  Graph *g2_local;
  Graph *g1_local;
  ulong local_10;
  
  pGStack_40 = g2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_graph.cpp"
             ,&local_a9);
  std::operator+(local_88,(char *)local_a8);
  std::__cxx11::to_string((__cxx11 *)&v2e1.write_.shared_alloc_.direct_ptr,0xf);
  std::operator+(local_68,local_88);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_41,"add_edges",file);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)&v2e1.write_.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  Read<int>::Read((Read<int> *)&e2v1.write_.shared_alloc_.direct_ptr,&g1->a2ab);
  Read<int>::Read((Read<int> *)&v2e2.write_.shared_alloc_.direct_ptr,&g1->ab2b);
  Read<int>::Read((Read<int> *)&e2v2.write_.shared_alloc_.direct_ptr,&g2->a2ab);
  Read<int>::Read((Read<int> *)local_120,&g2->ab2b);
  if (((ulong)e2v1.write_.shared_alloc_.direct_ptr & 1) == 0) {
    local_10 = *e2v1.write_.shared_alloc_.direct_ptr;
  }
  else {
    local_10 = (ulong)e2v1.write_.shared_alloc_.direct_ptr >> 3;
  }
  deg1.write_.shared_alloc_.direct_ptr._4_4_ = (int)(local_10 >> 2) + -1;
  Read<int>::Read(&local_148,(Read<int> *)&e2v1.write_.shared_alloc_.direct_ptr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_168,"deg1",(allocator *)((long)&deg2.write_.shared_alloc_.direct_ptr + 7));
  get_degrees((Omega_h *)local_138,&local_148,(string *)local_168);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&deg2.write_.shared_alloc_.direct_ptr + 7));
  Read<int>::~Read(&local_148);
  Read<int>::Read(&local_190,(Read<int> *)&e2v2.write_.shared_alloc_.direct_ptr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1b0,"deg2",(allocator *)((long)&deg.write_.shared_alloc_.direct_ptr + 7));
  get_degrees((Omega_h *)local_180,&local_190,(string *)local_1b0);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&deg.write_.shared_alloc_.direct_ptr + 7));
  Read<int>::~Read(&local_190);
  Read<int>::Read(&local_1d8,(Read<int> *)local_138);
  Read<int>::Read(&local_1e8,(Read<int> *)local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_208,"deg1+2",(allocator *)((long)&v2e.write_.shared_alloc_.direct_ptr + 7));
  add_each<int>((Omega_h *)local_1c8,&local_1d8,&local_1e8,(string *)local_208);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&v2e.write_.shared_alloc_.direct_ptr + 7));
  Read<int>::~Read(&local_1e8);
  Read<int>::~Read(&local_1d8);
  Read<int>::Read(&local_230,(Read<int> *)local_1c8);
  Read<int>::name_abi_cxx11_((Read<int> *)&e2v.shared_alloc_.direct_ptr);
  offset_scan<int>((Omega_h *)local_220,&local_230,(string *)&e2v.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string((string *)&e2v.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_230);
  size_in = Read<int>::last((Read<int> *)local_220);
  Read<int>::name_abi_cxx11_((Read<int> *)&f.e2v2.write_.shared_alloc_.direct_ptr);
  Write<int>::Write((Write<int> *)local_260,size_in,
                    (string *)&f.e2v2.write_.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string((string *)&f.e2v2.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)local_2e0,(Read<int> *)&e2v1.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&f.v2e1.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&e2v2.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&f.v2e2.write_.shared_alloc_.direct_ptr,(Read<int> *)local_220);
  Write<int>::Write((Write<int> *)&f.v2e.write_.shared_alloc_.direct_ptr,(Write<int> *)local_260);
  Read<int>::Read((Read<int> *)&f.e2v.shared_alloc_.direct_ptr,
                  (Read<int> *)&v2e2.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&f.e2v1.write_.shared_alloc_.direct_ptr,(Read<int> *)local_120);
  parallel_for<Omega_h::add_edges(Omega_h::Graph,Omega_h::Graph)::__0>
            (deg1.write_.shared_alloc_.direct_ptr._4_4_,(type *)local_2e0,"add_edges");
  Read<int>::Read(&local_2f0,(Read<int> *)local_220);
  Write<int>::Write(&local_310,(Write<int> *)local_260);
  Read<int>::Read(&local_300,&local_310);
  Graph::Graph(__return_storage_ptr__,&local_2f0,&local_300);
  Read<int>::~Read(&local_300);
  Write<int>::~Write(&local_310);
  Read<int>::~Read(&local_2f0);
  add_edges(Omega_h::Graph,Omega_h::Graph)::$_0::~__0((__0 *)local_2e0);
  Write<int>::~Write((Write<int> *)local_260);
  Read<int>::~Read((Read<int> *)local_220);
  Read<int>::~Read((Read<int> *)local_1c8);
  Read<int>::~Read((Read<int> *)local_180);
  Read<int>::~Read((Read<int> *)local_138);
  Read<int>::~Read((Read<int> *)local_120);
  Read<int>::~Read((Read<int> *)&e2v2.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&v2e2.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&e2v1.write_.shared_alloc_.direct_ptr);
  ScopedTimer::~ScopedTimer(&local_41);
  return __return_storage_ptr__;
}

Assistant:

Graph add_edges(Graph g1, Graph g2) {
  OMEGA_H_TIME_FUNCTION;
  auto v2e1 = g1.a2ab;
  auto e2v1 = g1.ab2b;
  auto v2e2 = g2.a2ab;
  auto e2v2 = g2.ab2b;
  auto nv = v2e1.size() - 1;
  auto deg1 = get_degrees(v2e1, "deg1");
  auto deg2 = get_degrees(v2e2, "deg2");
  auto deg = add_each(deg1, deg2, "deg1+2");
  auto v2e = offset_scan(deg, v2e1.name());
  Write<LO> e2v(v2e.last(), e2v1.name());
  auto f = OMEGA_H_LAMBDA(LO v) {
    auto begin1 = v2e1[v];
    auto end1 = v2e1[v + 1];
    auto begin2 = v2e2[v];
    auto end2 = v2e2[v + 1];
    auto begin = v2e[v];
    auto end = v2e[v + 1];
    auto k = begin;
    for (auto j = begin1; j < end1; ++j) e2v[k++] = e2v1[j];
    for (auto j = begin2; j < end2; ++j) e2v[k++] = e2v2[j];
    OMEGA_H_CHECK(k == end);
  };
  parallel_for(nv, f, "add_edges");
  return Graph(v2e, e2v);
}